

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

size_t __thiscall
BamTools::Internal::BgzfStream::Write(BgzfStream *this,char *data,size_t dataLength)

{
  bool bVar1;
  unsigned_long *puVar2;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  char *buffer;
  uint copyLength;
  size_t blockLength;
  char *input;
  size_t numBytesWritten;
  BgzfStream *in_stack_00000260;
  BgzfStream *in_stack_ffffffffffffff98;
  unsigned_long local_50;
  unsigned_long local_48;
  uint local_3c;
  undefined8 local_38;
  void *local_30;
  ulong local_28;
  ulong local_20;
  void *local_18;
  size_t local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bamtools_noop();
  bamtools_noop();
  bVar1 = IsOpen(in_stack_ffffffffffffff98);
  if (bVar1) {
    local_28 = 0;
    local_30 = local_18;
    local_38 = 0x10000;
    while (local_28 < local_20) {
      local_48 = 0x10000 - (long)*(int *)(in_RDI + 4);
      local_50 = local_20 - local_28;
      puVar2 = std::min<unsigned_long>(&local_48,&local_50);
      local_3c = (uint)*puVar2;
      memcpy((void *)(*(long *)(in_RDI + 0x20) + (long)*(int *)(in_RDI + 4)),local_30,
             *puVar2 & 0xffffffff);
      *(uint *)(in_RDI + 4) = local_3c + *(int *)(in_RDI + 4);
      local_30 = (void *)((long)local_30 + (ulong)local_3c);
      local_28 = local_3c + local_28;
      if (*(int *)(in_RDI + 4) == 0x10000) {
        FlushBlock(in_stack_00000260);
      }
    }
    local_8 = local_28;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

std::size_t BgzfStream::Write(const char* data, const std::size_t dataLength)
{

    BT_ASSERT_X(m_device, "BgzfStream::Write() - trying to write to null IO device");
    BT_ASSERT_X((m_device->Mode() == IBamIODevice::WriteOnly),
                "BgzfStream::Write() - trying to write to non-writable IO device");

    // skip if file not open for writing
    if (!IsOpen()) return 0;

    // write blocks as needed til all data is written
    std::size_t numBytesWritten = 0;
    const char* input = data;
    const std::size_t blockLength = Constants::BGZF_DEFAULT_BLOCK_SIZE;
    while (numBytesWritten < dataLength) {

        // copy data contents to uncompressed output buffer
        unsigned int copyLength =
            std::min(blockLength - m_blockOffset, dataLength - numBytesWritten);
        char* buffer = m_uncompressedBlock.Buffer;
        memcpy(buffer + m_blockOffset, input, copyLength);

        // update counter
        m_blockOffset += copyLength;
        input += copyLength;
        numBytesWritten += copyLength;

        // flush (& compress) output buffer when full
        if (m_blockOffset == static_cast<int32_t>(blockLength)) FlushBlock();
    }

    // return actual number of bytes written
    return numBytesWritten;
}